

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O3

BranchLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::_internal_mutable_branch(NeuralNetworkLayer *this)

{
  ulong uVar1;
  LayerUnion LVar2;
  Arena *arena;
  
  if (this->_oneof_case_[0] == 0x25d) {
    LVar2 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0x25d;
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      arena = *(Arena **)arena;
    }
    LVar2.branch_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::BranchLayerParams>
                   (arena);
    (this->layer_).branch_ = (BranchLayerParams *)LVar2;
  }
  return (BranchLayerParams *)LVar2.convolution_;
}

Assistant:

inline ::CoreML::Specification::BranchLayerParams* NeuralNetworkLayer::_internal_mutable_branch() {
  if (!_internal_has_branch()) {
    clear_layer();
    set_has_branch();
    layer_.branch_ = CreateMaybeMessage< ::CoreML::Specification::BranchLayerParams >(GetArenaForAllocation());
  }
  return layer_.branch_;
}